

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  EnumDescriptor **ppEVar1;
  csharp *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long lVar2;
  MessageGenerator *pMVar3;
  int iVar4;
  mapped_type *pmVar5;
  Options *pOVar6;
  long *plVar7;
  undefined8 *puVar8;
  FieldGeneratorBase *pFVar9;
  Descriptor *pDVar10;
  ulong *puVar11;
  size_type *psVar12;
  char *pcVar13;
  FileDescriptor *descriptor;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *pFVar14;
  Printer *pPVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  key_type local_178;
  Printer *local_158;
  MessageGenerator *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  EnumGenerator enumGenerator;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  key_type local_78;
  long local_58;
  string local_50;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&enumGenerator.descriptor_;
  lVar17 = **(long **)(this->descriptor_ + 8);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&enumGenerator,lVar17,(*(long **)(this->descriptor_ + 8))[1] + lVar17);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"class_name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_178);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.descriptor_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase);
  }
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"access_level","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_178);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.descriptor_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase);
  }
  WriteMessageDocComment(printer,this->descriptor_);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4a) == '\x01') {
    io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
  }
  pOVar6 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  if (pOVar6->serializable == true) {
    io::Printer::Print<>(printer,"[global::System.SerializableAttribute]\n");
  }
  io::Printer::Print(printer,&vars,"$access_level$ sealed partial class $class_name$ : ");
  pcVar13 = "pb::IMessage<$class_name$>\n";
  if (this->has_extension_ranges_ != false) {
    pcVar13 = "pb::IExtendableMessage<$class_name$>\n";
  }
  io::Printer::Print(printer,&vars,pcVar13);
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Print<>(printer,"    , pb::IBufferMessage\n");
  io::Printer::Print<>(printer,"#endif\n");
  io::Printer::Print<>(printer,"{\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
                    );
  io::Printer::Print<>(printer,"private pb::UnknownFieldSet _unknownFields;\n");
  if (this->has_extension_ranges_ == true) {
    iVar4 = std::__cxx11::string::compare((char *)**(undefined8 **)(this->descriptor_ + 0x10));
    pcVar13 = "private pb::ExtensionSet<$class_name$> _extensions;\n";
    if (iVar4 == 0) {
      pcVar13 = "internal pb::ExtensionSet<$class_name$> _extensions;\n";
    }
    io::Printer::Print(printer,&vars,pcVar13);
    io::Printer::Print(printer,&vars,
                       "private pb::ExtensionSet<$class_name$> _Extensions { get { return _extensions; } }\n"
                      );
  }
  local_158 = printer;
  local_150 = this;
  if (0 < this->has_bit_field_count_) {
    iVar4 = 0;
    do {
      ppEVar1 = &enumGenerator.descriptor_;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar1;
      pcVar13 = FastInt32ToBufferLeft(iVar4,(char *)ppEVar1);
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)(pcVar13 + -(long)ppEVar1);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,
                 enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                 (char *)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->file_extension
                                 )._M_dataplus._M_p +
                         (long)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase));
      io::Printer::Print<char[2],std::__cxx11::string>
                (local_158,"private int _hasBits$i$;\n",(char (*) [2])"i",&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_150->has_bit_field_count_);
  }
  pMVar3 = local_150;
  pPVar15 = local_158;
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_150->super_SourceGeneratorBase,local_158)
  ;
  io::Printer::Print(pPVar15,&vars,
                     "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n"
                    );
  this_00 = *(csharp **)(pMVar3->descriptor_ + 0x18);
  if (this_00 == (csharp *)0x0) {
    GetReflectionClassName_abi_cxx11_(&local_50,*(csharp **)(pMVar3->descriptor_ + 0x10),descriptor)
    ;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    puVar11 = puVar8 + 2;
    if ((ulong *)*puVar8 == puVar11) {
      local_d8 = *puVar11;
      lStack_d0 = puVar8[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar11;
      local_e8 = (ulong *)*puVar8;
    }
    local_e0 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    pDVar10 = pMVar3->descriptor_;
    plVar7 = (long *)(*(long *)(pDVar10 + 0x10) + 0x58);
    if (*(long *)(pDVar10 + 0x18) != 0) {
      plVar7 = (long *)(*(long *)(pDVar10 + 0x18) + 0x38);
    }
    ppEVar1 = &enumGenerator.descriptor_;
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar1;
    pcVar13 = FastInt32ToBufferLeft
                        ((int)((ulong)((long)pDVar10 - *plVar7) >> 3) * -0xf0f0f0f,(char *)ppEVar1);
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)(pcVar13 + -(long)ppEVar1);
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase
               ,(char *)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->file_extension)
                                ._M_dataplus._M_p +
                        (long)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase));
    uVar16 = 0xf;
    if (local_e8 != &local_d8) {
      uVar16 = local_d8;
    }
    if (uVar16 < (ulong)(local_90 + local_e0)) {
      uVar16 = 0xf;
      if (local_98 != local_88) {
        uVar16 = local_88[0];
      }
      if (uVar16 < (ulong)(local_90 + local_e0)) goto LAB_002bf3ac;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_002bf3ac:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_98);
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_148.field_2._M_allocated_capacity = *psVar12;
      local_148.field_2._8_8_ = puVar8[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar12;
      local_148._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_148._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)psVar12 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_178.field_2._M_allocated_capacity = *psVar12;
      local_178.field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
      local_178.field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar12;
      local_178._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_178._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"descriptor_accessor","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_78);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pPVar15 = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002bf527;
  }
  else {
    GetClassName_abi_cxx11_(&local_50,this_00,(Descriptor *)descriptor);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_d8 = *puVar11;
      lStack_d0 = plVar7[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar11;
      local_e8 = (ulong *)*plVar7;
    }
    local_e0 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pDVar10 = pMVar3->descriptor_;
    plVar7 = (long *)(*(long *)(pDVar10 + 0x10) + 0x58);
    if (*(long *)(pDVar10 + 0x18) != 0) {
      plVar7 = (long *)(*(long *)(pDVar10 + 0x18) + 0x38);
    }
    ppEVar1 = &enumGenerator.descriptor_;
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar1;
    pcVar13 = FastInt32ToBufferLeft
                        ((int)((ulong)((long)pDVar10 - *plVar7) >> 3) * -0xf0f0f0f,(char *)ppEVar1);
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)(pcVar13 + -(long)ppEVar1);
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase
               ,(char *)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->file_extension)
                                ._M_dataplus._M_p +
                        (long)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase));
    uVar16 = 0xf;
    if (local_e8 != &local_d8) {
      uVar16 = local_d8;
    }
    if (uVar16 < (ulong)(local_90 + local_e0)) {
      uVar16 = 0xf;
      if (local_98 != local_88) {
        uVar16 = local_88[0];
      }
      if (uVar16 < (ulong)(local_90 + local_e0)) goto LAB_002bf153;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_002bf153:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_98);
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_148.field_2._M_allocated_capacity = *psVar12;
      local_148.field_2._8_8_ = puVar8[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar12;
      local_148._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_148._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)psVar12 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_178.field_2._M_allocated_capacity = *psVar12;
      local_178.field_2._8_4_ = (undefined4)plVar7[3];
      local_178.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar12;
      local_178._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_178._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"descriptor_accessor","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_78);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pPVar15 = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002bf527;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_002bf527:
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&pMVar3->super_SourceGeneratorBase,pPVar15);
  io::Printer::Print(pPVar15,&vars,
                     "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&pMVar3->super_SourceGeneratorBase,pPVar15);
  io::Printer::Print(pPVar15,&vars,
                     "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&pMVar3->super_SourceGeneratorBase,pPVar15);
  io::Printer::Print(pPVar15,&vars,
                     "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n"
                    );
  GenerateCloningCode(pMVar3,pPVar15);
  pDVar10 = pMVar3->descriptor_;
  if (0 < *(int *)(pDVar10 + 4)) {
    lVar17 = 0;
    lVar18 = 0;
    pFVar14 = extraout_RDX;
    do {
      lVar19 = *(long *)(pDVar10 + 0x28);
      args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar19 + 8 + lVar17);
      GetFieldConstantName_abi_cxx11_(&local_178,(csharp *)(lVar19 + lVar17),pFVar14);
      ppEVar1 = &enumGenerator.descriptor_;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar1;
      pcVar13 = FastInt32ToBufferLeft(*(int32 *)(lVar19 + 4 + lVar17),(char *)ppEVar1);
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)(pcVar13 + -(long)ppEVar1);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                 (char *)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->file_extension
                                 )._M_dataplus._M_p +
                         (long)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase));
      io::Printer::
      Print<char[11],std::__cxx11::string,char[20],std::__cxx11::string,char[6],std::__cxx11::string>
                (local_158,
                 "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
                 ,(char (*) [11])0x3ff194,args_1,(char (*) [20])"field_constant_name",&local_178,
                 (char (*) [6])0x3f1802,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      pFVar9 = CreateFieldGeneratorInternal(local_150,(FieldDescriptor *)(lVar19 + lVar17));
      pPVar15 = local_158;
      (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[6])(pFVar9,local_158);
      io::Printer::Print<>(pPVar15,"\n");
      (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar9);
      lVar18 = lVar18 + 1;
      pDVar10 = local_150->descriptor_;
      lVar17 = lVar17 + 0x48;
      pFVar14 = extraout_RDX_00;
    } while (lVar18 < *(int *)(pDVar10 + 4));
  }
  pPVar15 = local_158;
  if (0 < *(int *)(pDVar10 + 0x6c)) {
    lVar17 = 0;
    do {
      lVar18 = *(long *)(pDVar10 + 0x30);
      local_58 = lVar17;
      UnderscoresToCamelCase
                ((string *)&enumGenerator,*(string **)(lVar18 + 8 + lVar17 * 0x28),false,false);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_178);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.descriptor_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase);
      }
      lVar18 = lVar18 + lVar17 * 0x28;
      UnderscoresToCamelCase((string *)&enumGenerator,*(string **)(lVar18 + 8),true,false);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"property_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_178);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.descriptor_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase);
      }
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)&enumGenerator.descriptor_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&enumGenerator,"original_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(string *)&enumGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.descriptor_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase);
      }
      io::Printer::Print(pPVar15,&vars,
                         "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
                        );
      io::Printer::Indent(pPVar15);
      io::Printer::Print<>(pPVar15,"None = 0,\n");
      if (0 < *(int *)(lVar18 + 4)) {
        lVar19 = 0;
        lVar17 = 0;
        pFVar14 = extraout_RDX_01;
        do {
          lVar2 = *(long *)(lVar18 + 0x20);
          GetPropertyName_abi_cxx11_(&local_178,(csharp *)(lVar2 + lVar19),pFVar14);
          ppEVar1 = &enumGenerator.descriptor_;
          enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar1;
          pcVar13 = FastInt32ToBufferLeft(*(int32 *)(lVar2 + 4 + lVar19),(char *)ppEVar1);
          enumGenerator.super_SourceGeneratorBase.options_ = (Options *)(pcVar13 + -(long)ppEVar1);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,
                     enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                     (char *)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                     file_extension)._M_dataplus._M_p +
                             (long)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase
                             ));
          pPVar15 = local_158;
          io::Printer::Print<char[20],std::__cxx11::string,char[6],std::__cxx11::string>
                    (local_158,"$field_property_name$ = $index$,\n",
                     (char (*) [20])"field_property_name",&local_178,(char (*) [6])0x3f1802,
                     &local_148);
          pFVar14 = extraout_RDX_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
            pFVar14 = extraout_RDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
            pFVar14 = extraout_RDX_04;
          }
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 0x48;
        } while (lVar17 < *(int *)(lVar18 + 4));
      }
      io::Printer::Outdent(pPVar15);
      io::Printer::Print<>(pPVar15,"}\n");
      io::Printer::Print(pPVar15,&vars,
                         "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n"
                        );
      SourceGeneratorBase::WriteGeneratedCodeAttributes
                (&local_150->super_SourceGeneratorBase,pPVar15);
      io::Printer::Print(pPVar15,&vars,
                         "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
                        );
      SourceGeneratorBase::WriteGeneratedCodeAttributes
                (&local_150->super_SourceGeneratorBase,pPVar15);
      io::Printer::Print(pPVar15,&vars,
                         "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
                        );
      lVar17 = local_58 + 1;
      pDVar10 = local_150->descriptor_;
    } while (lVar17 < *(int *)(pDVar10 + 0x6c));
  }
  pMVar3 = local_150;
  GenerateFrameworkMethods(local_150,pPVar15);
  GenerateMessageSerializationMethods(pMVar3,pPVar15);
  GenerateMergingMethods(pMVar3,pPVar15);
  if (pMVar3->has_extension_ranges_ == true) {
    io::Printer::Print(pPVar15,&vars,
                       "public TValue GetExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.GetOrInitialize(ref _extensions, extension);\n}\npublic void SetExtension<TValue>(pb::Extension<$class_name$, TValue> extension, TValue value) {\n  pb::ExtensionSet.Set(ref _extensions, extension, value);\n}\npublic bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Has(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\n\n"
                      );
  }
  pDVar10 = pMVar3->descriptor_;
  if (*(int *)(pDVar10 + 0x74) < 1) {
    if (0 < (long)*(int *)(pDVar10 + 0x70)) {
      lVar17 = 0;
      do {
        if (*(char *)(*(long *)(*(long *)(pDVar10 + 0x38) + 0x20 + lVar17) + 0x4b) == '\0')
        goto LAB_002bf9fa;
        lVar17 = lVar17 + 0x88;
      } while ((long)*(int *)(pDVar10 + 0x70) * 0x88 != lVar17);
    }
  }
  else {
LAB_002bf9fa:
    io::Printer::Print(pPVar15,&vars,
                       "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&pMVar3->super_SourceGeneratorBase,pPVar15);
    io::Printer::Print<>(pPVar15,"public static partial class Types {\n");
    io::Printer::Indent(pPVar15);
    pDVar10 = pMVar3->descriptor_;
    if (0 < *(int *)(pDVar10 + 0x74)) {
      lVar18 = 0;
      lVar17 = 0;
      do {
        lVar19 = *(long *)(pDVar10 + 0x40);
        pOVar6 = SourceGeneratorBase::options(&pMVar3->super_SourceGeneratorBase);
        EnumGenerator::EnumGenerator(&enumGenerator,(EnumDescriptor *)(lVar19 + lVar18),pOVar6);
        EnumGenerator::Generate(&enumGenerator,local_158);
        EnumGenerator::~EnumGenerator(&enumGenerator);
        lVar17 = lVar17 + 1;
        pDVar10 = pMVar3->descriptor_;
        lVar18 = lVar18 + 0x48;
      } while (lVar17 < *(int *)(pDVar10 + 0x74));
    }
    if (0 < *(int *)(pDVar10 + 0x70)) {
      lVar18 = 0;
      lVar17 = 0;
      do {
        lVar19 = *(long *)(pDVar10 + 0x38);
        if (*(char *)(*(long *)(lVar19 + 0x20 + lVar18) + 0x4b) == '\0') {
          pOVar6 = SourceGeneratorBase::options(&pMVar3->super_SourceGeneratorBase);
          MessageGenerator((MessageGenerator *)&enumGenerator,(Descriptor *)(lVar19 + lVar18),pOVar6
                          );
          Generate((MessageGenerator *)&enumGenerator,local_158);
          ~MessageGenerator((MessageGenerator *)&enumGenerator);
          pDVar10 = pMVar3->descriptor_;
        }
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + 0x88;
      } while (lVar17 < *(int *)(pDVar10 + 0x70));
    }
    pPVar15 = local_158;
    io::Printer::Outdent(local_158);
    io::Printer::Print<>(pPVar15,"}\n#endregion\n\n");
    pDVar10 = pMVar3->descriptor_;
  }
  if (0 < *(int *)(pDVar10 + 0x7c)) {
    io::Printer::Print(pPVar15,&vars,
                       "#region Extensions\n/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&pMVar3->super_SourceGeneratorBase,pPVar15);
    io::Printer::Print<>(pPVar15,"public static partial class Extensions {\n");
    io::Printer::Indent(pPVar15);
    pDVar10 = pMVar3->descriptor_;
    if (0 < *(int *)(pDVar10 + 0x7c)) {
      lVar17 = 0;
      lVar18 = 0;
      do {
        pFVar9 = CreateFieldGeneratorInternal
                           (pMVar3,(FieldDescriptor *)(*(long *)(pDVar10 + 0x50) + lVar17));
        (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar9,pPVar15);
        (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar9);
        lVar18 = lVar18 + 1;
        pDVar10 = pMVar3->descriptor_;
        lVar17 = lVar17 + 0x48;
      } while (lVar18 < *(int *)(pDVar10 + 0x7c));
    }
    io::Printer::Outdent(pPVar15);
    io::Printer::Print<>(pPVar15,"}\n#endregion\n\n");
  }
  io::Printer::Outdent(pPVar15);
  io::Printer::Print<>(pPVar15,"}\n");
  io::Printer::Print<>(pPVar15,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  std::map<std::string, std::string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  AddSerializableAttribute(printer);

  printer->Print(
    vars,
    "$access_level$ sealed partial class $class_name$ : ");

  if (has_extension_ranges_) {
    printer->Print(vars, "pb::IExtendableMessage<$class_name$>\n");
  }
  else {
    printer->Print(vars, "pb::IMessage<$class_name$>\n");
  }
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Print("    , pb::IBufferMessage\n");
  printer->Print("#endif\n");
  printer->Print("{\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
      vars,
      "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  printer->Print(
      "private pb::UnknownFieldSet _unknownFields;\n");

  if (has_extension_ranges_) {
    if (IsDescriptorProto(descriptor_->file())) {
      printer->Print(vars, "internal pb::ExtensionSet<$class_name$> _extensions;\n"); // CustomOptions compatibility
    } else {
      printer->Print(vars, "private pb::ExtensionSet<$class_name$> _extensions;\n");
    }

    // a read-only property for fast
    // retrieval of the set in IsInitialized
    printer->Print(vars,
                   "private pb::ExtensionSet<$class_name$> _Extensions { get { "
                   "return _extensions; } }\n");
  }

  for (int i = 0; i < has_bit_field_count_; i++) {
    // don't use arrays since all arrays are heap allocated, saving allocations
    // use ints instead of bytes since bytes lack bitwise operators, saving casts
    printer->Print("private int _hasBits$i$;\n", "i", StrCat(i));
  }

  WriteGeneratedCodeAttributes(printer);

  printer->Print(
      vars,
      "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] = GetReflectionClassName(descriptor_->file())
        + ".Descriptor.MessageTypes[" + StrCat(descriptor_->index()) + "]";
  } else {
    vars["descriptor_accessor"] = GetClassName(descriptor_->containing_type())
        + ".Descriptor.NestedTypes[" + StrCat(descriptor_->index()) + "]";
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public static pbr::MessageDescriptor Descriptor {\n"
    "  get { return $descriptor_accessor$; }\n"
    "}\n"
    "\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
    "  get { return Descriptor; }\n"
    "}\n"
    "\n");

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$() {\n"
    "  OnConstruction();\n"
    "}\n\n"
    "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
      "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
      "public const int $field_constant_name$ = $index$;\n",
      "field_name", fieldDescriptor->name(),
      "field_constant_name", GetFieldConstantName(fieldDescriptor),
      "index", StrCat(fieldDescriptor->number()));
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties (for real oneofs, which come before synthetic ones)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    vars["original_name"] = oneof->name();
    printer->Print(
      vars,
      "private object $name$_;\n"
      "/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\n"
      "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$field_property_name$ = $index$,\n",
                     "field_property_name", GetPropertyName(field),
                     "index", StrCat(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
    printer->Print(
      vars,
      "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
      vars,
      "public $property_name$OneofCase $property_name$Case {\n"
      "  get { return $name$Case_; }\n"
      "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
      vars,
      "public void Clear$property_name$() {\n"
      "  $name$Case_ = $property_name$OneofCase.None;\n"
      "  $name$_ = null;\n"
      "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  if (has_extension_ranges_) {
    printer->Print(
        vars,
        "public TValue GetExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.GetOrInitialize(ref _extensions, "
        "extension);\n"
        "}\n"
        "public void SetExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension, TValue value) {\n"
        "  pb::ExtensionSet.Set(ref _extensions, extension, value);\n"
        "}\n"
        "public bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Has(ref _extensions, extension);\n"
        "}\n"
        "public void ClearExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n"
        "public void "
        "ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n\n");
  }

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(
      vars,
      "#region Nested types\n"
      "/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(
            descriptor_->nested_type(i), this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n"
                   "#endregion\n"
                   "\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print(
      vars,
      "#region Extensions\n"
      "/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Extensions {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->extension_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->extension(i)));
      generator->GenerateExtensionCode(printer);
    }
    printer->Outdent();
    printer->Print(
      "}\n"
      "#endregion\n"
      "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}